

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O0

bool __thiscall duckdb::interval_t::operator==(interval_t *this,interval_t *right)

{
  interval_t *in_RSI;
  interval_t *in_RDI;
  int64_t rmicros;
  int64_t rdays;
  int64_t rmonths;
  int64_t lmicros;
  int64_t ldays;
  int64_t lmonths;
  interval_t *left;
  bool local_51;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28 [2];
  interval_t *local_18;
  bool local_1;
  
  if (((in_RDI->months == in_RSI->months) && (in_RDI->days == in_RSI->days)) &&
     (in_RDI->micros == in_RSI->micros)) {
    local_1 = true;
  }
  else {
    local_18 = in_RSI;
    Normalize(in_RDI,local_28,&local_30,&local_38);
    Normalize(local_18,&local_40,&local_48,&local_50);
    local_51 = false;
    if ((local_28[0] == local_40) && (local_51 = false, local_30 == local_48)) {
      local_51 = local_38 == local_50;
    }
    local_1 = local_51;
  }
  return local_1;
}

Assistant:

inline bool operator==(const interval_t &right) const {
		//	Quick equality check
		const auto &left = *this;
		if (left.months == right.months && left.days == right.days && left.micros == right.micros) {
			return true;
		}

		int64_t lmonths, ldays, lmicros;
		int64_t rmonths, rdays, rmicros;
		left.Normalize(lmonths, ldays, lmicros);
		right.Normalize(rmonths, rdays, rmicros);

		return lmonths == rmonths && ldays == rdays && lmicros == rmicros;
	}